

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::MemberAccessExpressionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,MemberAccessExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  size_t index_local;
  MemberAccessExpressionSyntax *this_local;
  
  if (index == 0) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->left)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 1) {
    token.kind = (this->dot).kind;
    token._2_1_ = (this->dot).field_0x2;
    token.numFlags.raw = (this->dot).numFlags.raw;
    token.rawLen = (this->dot).rawLen;
    token.info = (this->dot).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax MemberAccessExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return left.get();
        case 1: return dot;
        case 2: return name;
        default: return nullptr;
    }
}